

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O2

int mbedtls_camellia_setkey_dec(mbedtls_camellia_context *ctx,uchar *key,uint keybits)

{
  undefined8 uVar1;
  int iVar2;
  ulong uVar3;
  uint32_t *puVar4;
  mbedtls_camellia_context cty;
  mbedtls_camellia_context local_134;
  
  memset(&local_134,0,0x114);
  iVar2 = mbedtls_camellia_setkey_enc(&local_134,key,keybits);
  if (iVar2 == 0) {
    ctx->nr = local_134.nr;
    uVar3 = (ulong)(local_134.nr == 4);
    uVar1 = *(undefined8 *)(local_134.rk + uVar3 * 0x10 + 0x32);
    *(undefined8 *)ctx->rk = *(undefined8 *)(local_134.rk + uVar3 * 0x10 + 0x30);
    *(undefined8 *)(ctx->rk + 2) = uVar1;
    puVar4 = ctx->rk + 4;
    uVar3 = (ulong)((uint)(local_134.nr == 4) * 8 + 0x16);
    while (uVar3 != 0) {
      *(undefined8 *)puVar4 = *(undefined8 *)(local_134.rk + uVar3 * 2 + 2);
      puVar4 = puVar4 + 2;
      uVar3 = uVar3 - 1;
    }
    uVar1 = *(undefined8 *)(local_134.rk + 2);
    *(undefined8 *)puVar4 = *(undefined8 *)local_134.rk;
    *(undefined8 *)(puVar4 + 2) = uVar1;
  }
  mbedtls_camellia_free(&local_134);
  return iVar2;
}

Assistant:

int mbedtls_camellia_setkey_dec( mbedtls_camellia_context *ctx,
                                 const unsigned char *key,
                                 unsigned int keybits )
{
    int idx, ret;
    size_t i;
    mbedtls_camellia_context cty;
    uint32_t *RK;
    uint32_t *SK;
    CAMELLIA_VALIDATE_RET( ctx != NULL );
    CAMELLIA_VALIDATE_RET( key != NULL );

    mbedtls_camellia_init( &cty );

    /* Also checks keybits */
    if( ( ret = mbedtls_camellia_setkey_enc( &cty, key, keybits ) ) != 0 )
        goto exit;

    ctx->nr = cty.nr;
    idx = ( ctx->nr == 4 );

    RK = ctx->rk;
    SK = cty.rk + 24 * 2 + 8 * idx * 2;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

    for( i = 22 + 8 * idx, SK -= 6; i > 0; i--, SK -= 4 )
    {
        *RK++ = *SK++;
        *RK++ = *SK++;
    }

    SK -= 2;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

exit:
    mbedtls_camellia_free( &cty );

    return( ret );
}